

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int pre_match(c2m_ctx_t c2m_ctx,int c,pos_t *pos,node_code_t *node_code,node_t_conflict *node)

{
  stream_t psVar1;
  token_t ptVar2;
  int iVar3;
  int iVar4;
  node_t_conflict pnVar5;
  char *extraout_RDX;
  c2m_ctx_t c2m_ctx_00;
  pos_t p;
  
  c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->pre_ctx;
  psVar1 = c2m_ctx_00->cs;
  if (psVar1 == (stream_t)0x0) {
    pre_match_cold_3();
  }
  else {
    if (psVar1->f == (FILE *)0x0) {
      return 0;
    }
    if ((token_t *)psVar1->getc_func == (token_t *)0x0) goto LAB_00195b5e;
    ptVar2 = *(token_t *)((long)psVar1->getc_func + (psVar1->f[-1]._unused2 + 0x13) * 8);
    if (*(short *)ptVar2 != c) {
      return 0;
    }
    if (pos != (pos_t *)0x0) {
      iVar3 = (ptVar2->pos).lno;
      iVar4 = (ptVar2->pos).ln_pos;
      pos->fname = (ptVar2->pos).fname;
      pos->lno = iVar3;
      pos->ln_pos = iVar4;
    }
    if (node_code != (node_code_t *)0x0) {
      *node_code = ptVar2->node_code;
    }
    if (node != (node_t_conflict *)0x0) {
      *node = ptVar2->node;
    }
    psVar1 = c2m_ctx_00->cs;
    if (((psVar1 != (stream_t)0x0) && ((token_t *)psVar1->getc_func != (token_t *)0x0)) &&
       (node_code = (node_code_t *)psVar1->f, (FILE *)node_code != (FILE *)0x0)) {
      psVar1->f = (FILE *)(((FILE *)((long)node_code + -0xd8))->_unused2 + 0x13);
      return 1;
    }
  }
  pre_match_cold_1();
LAB_00195b5e:
  pre_match_cold_2();
  pnVar5 = new_node(c2m_ctx_00,c);
  op_append(c2m_ctx_00,pnVar5,(node_t_conflict)node);
  p._8_8_ = node_code;
  p.fname = extraout_RDX;
  pnVar5 = add_pos(c2m_ctx_00,pnVar5,p);
  return (int)pnVar5;
}

Assistant:

static int pre_match (c2m_ctx_t c2m_ctx, int c, pos_t *pos, node_code_t *node_code, node_t *node) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  token_t t;

  if (VARR_LENGTH (token_t, pre_expr) == 0) return FALSE;
  t = VARR_LAST (token_t, pre_expr);
  if (t->code != c) return FALSE;
  if (pos != NULL) *pos = t->pos;
  if (node_code != NULL) *node_code = t->node_code;
  if (node != NULL) *node = t->node;
  VARR_POP (token_t, pre_expr);
  return TRUE;
}